

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O3

void __thiscall
cinatra::coro_http_response::add_header<char_const*,char_const*>
          (coro_http_response *this,char *k,char *v)

{
  allocator<char> local_52;
  allocator<char> local_51;
  undefined1 local_50 [32];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,k,&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,v,&local_52);
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::
  emplace_back<cinatra::resp_header>(&this->resp_headers_,(resp_header *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
  }
  return;
}

Assistant:

void add_header(auto k, auto v) {
    resp_headers_.emplace_back(resp_header{std::move(k), std::move(v)});
  }